

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter.c
# Opt level: O3

double norm2(double *array,int N)

{
  ulong uVar1;
  double dVar2;
  
  dVar2 = 0.0;
  if (0 < N) {
    uVar1 = 0;
    do {
      dVar2 = dVar2 + array[uVar1] * array[uVar1];
      uVar1 = uVar1 + 1;
    } while ((uint)N != uVar1);
  }
  if (0.0 <= dVar2) {
    return SQRT(dVar2);
  }
  dVar2 = sqrt(dVar2);
  return dVar2;
}

Assistant:

double norm2(double *array, int N) {
	int i;
	double nrm;
	
	nrm = 0.0;
	for (i = 0; i < N; ++i) {
		nrm += array[i]*array[i];
	}
	nrm = sqrt(nrm);
	return nrm;
}